

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

int __thiscall
ctemplate_htmlparser::HtmlparserCppTest::NameToId
          (HtmlparserCppTest *this,IdNameMap *list,string *name)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char *pcVar2;
  size_t sVar3;
  IdNameMap *pIVar4;
  bool bVar5;
  int iVar6;
  int extraout_EAX;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *extraout_RAX;
  long lVar8;
  HtmlparserCppTest *pHVar9;
  HtmlparserCppTest *pHVar10;
  HtmlparserCppTest *pHVar11;
  HtmlparserCppTest *extraout_RAX_00;
  HtmlparserCppTest *pHVar12;
  HtmlparserCppTest *extraout_RAX_01;
  undefined7 extraout_var;
  undefined8 uVar13;
  undefined7 extraout_var_00;
  HtmlparserCppTest *extraout_RAX_02;
  char *extraout_RAX_03;
  HtmlparserCppTest *this_00;
  char *extraout_RAX_04;
  char *extraout_RAX_05;
  int *piVar14;
  HtmlParser *this_01;
  const_iterator cVar15;
  mapped_type *ppHVar16;
  undefined8 extraout_RAX_06;
  undefined7 uVar17;
  ulong uVar18;
  htmlparser_ctx *phVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  htmlparser_ctx_s *phVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  pointer this_02;
  _Base_ptr unaff_R12;
  string *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar25;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_260;
  _Base_ptr p_Stack_248;
  _Base_ptr p_Stack_240;
  undefined1 auStack_200 [16];
  _Base_ptr p_Stack_1f0;
  HtmlparserCppTest *pHStack_1e8;
  _Base_ptr p_Stack_1e0;
  undefined1 auStack_1d8 [16];
  _Base_ptr p_Stack_1c8;
  HtmlparserCppTest *pHStack_1c0;
  _Base_ptr p_Stack_1b8;
  char *pcStack_1b0;
  HtmlParser HStack_1a8;
  allocator aStack_169;
  HtmlparserCppTest *pHStack_168;
  size_t sStack_160;
  HtmlparserCppTest HStack_158;
  HtmlparserCppTest *pHStack_118;
  ulong uStack_110;
  HtmlparserCppTest *pHStack_100;
  allocator aStack_e9;
  HtmlparserCppTest *pHStack_e8;
  size_t sStack_e0;
  undefined1 auStack_d8 [40];
  HtmlparserCppTest *pHStack_b0;
  HtmlParser HStack_a8;
  HtmlparserCppTest HStack_a0;
  IdNameMap *pIStack_60;
  string *psStack_58;
  allocator aStack_49;
  HtmlparserCppTest *pHStack_48;
  char *pcStack_40;
  
  if (list != (IdNameMap *)0x0) {
    pcVar2 = list->name;
    while (pcVar2 != (char *)0x0) {
      iVar6 = std::__cxx11::string::compare((char *)name);
      if (iVar6 == 0) goto LAB_00106f1c;
      pIVar4 = list + 1;
      list = list + 1;
      pcVar2 = pIVar4->name;
    }
    NameToId();
LAB_00106f1c:
    return list->id;
  }
  NameToId();
  pHVar12 = (HtmlparserCppTest *)(this->parser_).parser_;
  psStack_58 = (string *)0x106f3f;
  iVar6 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar12);
  puVar20 = kStateMap;
  psStack_58 = (string *)0x106f4d;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kStateMap,iVar6);
  if (list->name == (char *)0x0) {
    psStack_58 = (string *)0x106fb6;
    ValidateState();
  }
  else {
    unaff_R14 = (string *)&pHStack_48;
    psStack_58 = (string *)0x106f69;
    std::__cxx11::string::string(unaff_R14,(char *)pHVar7,&aStack_49);
    pcVar2 = list->name;
    puVar20 = (undefined1 *)pHVar7;
    if (pcVar2 == pcStack_40) {
      uVar17 = (undefined7)((ulong)list >> 8);
      if (pcVar2 == (char *)0x0) {
        list = (IdNameMap *)CONCAT71(uVar17,1);
      }
      else {
        psStack_58 = (string *)0x106f85;
        puVar20 = (undefined1 *)pHStack_48;
        iVar6 = bcmp(*(void **)list,pHStack_48,(size_t)pcVar2);
        list = (IdNameMap *)CONCAT71(uVar17,iVar6 == 0);
      }
    }
    else {
      list = (IdNameMap *)0x0;
    }
    pHVar7 = (HtmlparserCppTest *)&stack0xffffffffffffffc8;
    if (pHStack_48 != pHVar7) {
      psStack_58 = (string *)0x106fa5;
      operator_delete(pHStack_48);
      pHVar7 = extraout_RAX;
    }
    pHVar12 = pHStack_48;
    if ((char)list != '\0') {
      return (int)pHVar7;
    }
  }
  psStack_58 = (string *)0x106fbb;
  ValidateState();
  pHVar7 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106fcf;
  pHVar9 = (HtmlparserCppTest *)puVar20;
  pIStack_60 = list;
  psStack_58 = unaff_R14;
  lVar8 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar7);
  if (lVar8 == 0) {
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106ff9;
    ValidateTag();
  }
  else {
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106fdd;
    pHVar9 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar12->parser_).parser_);
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106fe8;
    pHVar7 = (HtmlparserCppTest *)puVar20;
    iVar6 = std::__cxx11::string::compare(puVar20);
    if (iVar6 == 0) {
      return 0;
    }
  }
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  this_00 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107011;
  pHVar10 = pHVar9;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar20;
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)pHVar12;
  lVar8 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)this_00);
  if (lVar8 == 0) {
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10703b;
    ValidateAttribute();
  }
  else {
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10701f;
    pHVar10 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar7->parser_).parser_);
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10702a;
    this_00 = pHVar9;
    iVar6 = std::__cxx11::string::compare((char *)pHVar9);
    if (iVar6 == 0) {
      return 0;
    }
  }
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar12 = (HtmlparserCppTest *)(this_00->parser_).parser_;
  auStack_d8._24_8_ = (_Base_ptr)0x107056;
  pHVar11 = pHVar10;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar9;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar7;
  lVar8 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar12);
  if (lVar8 != 0) {
    auStack_d8._24_8_ = (_Base_ptr)0x107064;
    pHVar11 = (HtmlparserCppTest *)
              ctemplate_htmlparser::htmlparser_value((this_00->parser_).parser_);
    this_00 = (HtmlparserCppTest *)&pHStack_b0;
    auStack_d8._24_8_ = (_Base_ptr)0x107079;
    pHVar12 = this_00;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar11,(allocator *)(auStack_d8 + 0x27))
    ;
    phVar19 = *(htmlparser_ctx **)
               &(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (phVar19 == HStack_a8.parser_) {
      if (phVar19 == (htmlparser_ctx *)0x0) {
LAB_00107099:
        pHVar12 = &HStack_a0;
        if (pHStack_b0 != pHVar12) {
          auStack_d8._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(pHStack_b0);
          pHVar12 = extraout_RAX_00;
        }
        return (int)pHVar12;
      }
      pHVar12 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
      auStack_d8._24_8_ = (_Base_ptr)0x107095;
      pHVar11 = pHStack_b0;
      iVar6 = bcmp(pHVar12,pHStack_b0,(size_t)phVar19);
      if (iVar6 == 0) goto LAB_00107099;
    }
    auStack_d8._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_d8._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_d8._24_8_ = this_00;
  auStack_d8._16_8_ = pHVar10;
  pHVar12 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  iVar6 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar12);
  puVar20 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kAttributeTypeMap,iVar6);
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_e8;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar7,&aStack_e9);
    sVar3 = *(size_t *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar20 = (undefined1 *)pHVar7;
    if (sVar3 == sStack_e0) {
      uVar17 = (undefined7)((ulong)pHVar11 >> 8);
      if (sVar3 == 0) {
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar17,1);
      }
      else {
        puVar20 = (undefined1 *)pHStack_e8;
        iVar6 = bcmp(*(void **)&(pHVar11->contextMap)._M_t._M_impl,pHStack_e8,sVar3);
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar17,iVar6 == 0);
      }
    }
    else {
      pHVar11 = (HtmlparserCppTest *)0x0;
    }
    pHVar7 = (HtmlparserCppTest *)auStack_d8;
    if (pHStack_e8 != pHVar7) {
      operator_delete(pHStack_e8);
      pHVar7 = extraout_RAX_01;
    }
    pHVar12 = pHStack_e8;
    if ((char)pHVar11 != '\0') {
      return (int)pHVar7;
    }
  }
  ValidateAttributeType();
  uStack_110 = 0x10715c;
  pHStack_100 = pHVar11;
  bVar5 = StringToBool((string *)puVar20);
  uVar18 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
  phVar22 = (pHVar12->parser_).parser_;
  uStack_110 = 0x107167;
  uVar13 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar22);
  bVar5 = (int)uVar13 != 0;
  if (SUB81(uVar18,0) == bVar5) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar5);
  }
  uStack_110 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_118 = pHVar12;
  uStack_110 = uVar18;
  bVar5 = StringToBool((string *)puVar20);
  phVar19 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar5) & 0xffffffff);
  p_Var23 = *(_Base_ptr *)(phVar22 + 0x30);
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x107197;
  uVar13 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var23);
  bVar5 = (int)uVar13 != 0;
  if (SUB81(phVar19,0) == bVar5) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar5);
  }
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar22;
  HStack_158.parser_.parser_ = phVar19;
  bVar5 = StringToBool((string *)puVar20);
  p_Var24 = p_Var23[1]._M_left;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  uVar13 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var24);
  bVar25 = (int)uVar13 != 0;
  if (bVar5 == bVar25) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar12 = (HtmlparserCppTest *)p_Var24[1]._M_left;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var23;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this_00;
  iVar6 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar12);
  puVar21 = kJavascriptStateMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kJavascriptStateMap,iVar6);
  if (*(long *)&(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_168;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar7,&aStack_169);
    sVar3 = *(size_t *)
             &(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar21 = (undefined1 *)pHVar7;
    if (sVar3 == sStack_160) {
      if (sVar3 == 0) {
        bVar5 = true;
      }
      else {
        puVar21 = (undefined1 *)pHStack_168;
        iVar6 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl,
                     pHStack_168,sVar3);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    pHVar7 = &HStack_158;
    if (pHStack_168 != pHVar7) {
      operator_delete(pHStack_168);
      pHVar7 = extraout_RAX_02;
    }
    pHVar12 = pHStack_168;
    if (bVar5) {
      return (int)pHVar7;
    }
  }
  ValidateJavascriptState();
  bVar5 = StringToBool((string *)puVar21);
  p_Var23 = (_Base_ptr)(pHVar12->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var23);
  bVar25 = (int)uVar13 != 0;
  if (bVar5 == bVar25) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  ValidateInCss();
  pHVar7 = (HtmlparserCppTest *)&pcStack_1b0;
  HStack_1a8.parser_ = (htmlparser_ctx *)pHVar12;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar5 = false;
    p_Var24 = p_Var23;
  }
  else {
    p_Stack_1b8 = (_Base_ptr)0x1072b8;
    pcStack_1b0 = extraout_RAX_03;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var24 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    p_Stack_1b8 = (_Base_ptr)0x1072d4;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var24,&pcStack_1b0,10);
    puVar21 = (undefined1 *)pHVar7;
    if (*pcStack_1b0 == '\0') {
      bVar5 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_1b0;
    }
    else {
      bVar5 = false;
      unaff_R12 = (_Base_ptr)&pcStack_1b0;
    }
  }
  if (bVar5) {
    p_Var24 = p_Var23[1]._M_left;
    p_Stack_1b8 = (_Base_ptr)0x1072fc;
    iVar6 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var24);
    if ((int)this_00 == iVar6) {
      return iVar6;
    }
  }
  else {
    p_Stack_1b8 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_1b8 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar12 = (HtmlparserCppTest *)auStack_1d8;
  auStack_1d8._8_8_ = p_Var23;
  p_Stack_1c8 = unaff_R12;
  pHStack_1c0 = this_00;
  p_Stack_1b8 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar5 = false;
    p_Var23 = p_Var24;
  }
  else {
    p_Stack_1e0 = (_Base_ptr)0x107332;
    auStack_1d8._0_8_ = extraout_RAX_04;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var23 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    p_Stack_1e0 = (_Base_ptr)0x10734e;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var23,(char **)auStack_1d8,10);
    puVar21 = (undefined1 *)pHVar12;
    if (*(char *)auStack_1d8._0_8_ == '\0') {
      bVar5 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_1d8;
    }
    else {
      bVar5 = false;
      unaff_R12 = (_Base_ptr)auStack_1d8;
    }
  }
  if (bVar5) {
    p_Var23 = p_Var24[1]._M_left;
    p_Stack_1e0 = (_Base_ptr)0x107376;
    iVar6 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var23);
    if ((int)this_00 == iVar6) {
      return iVar6;
    }
  }
  else {
    p_Stack_1e0 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_1e0 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar12 = (HtmlparserCppTest *)auStack_200;
  auStack_200._8_8_ = p_Var24;
  p_Stack_1f0 = unaff_R12;
  pHStack_1e8 = this_00;
  p_Stack_1e0 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar5 = false;
    p_Var24 = p_Var23;
  }
  else {
    auStack_200._0_8_ = extraout_RAX_05;
    piVar14 = __errno_location();
    *piVar14 = 0;
    p_Var24 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var24,(char **)auStack_200,10);
    puVar21 = (undefined1 *)pHVar12;
    if (*(char *)auStack_200._0_8_ == '\0') {
      bVar5 = *piVar14 == 0;
      unaff_R12 = (_Base_ptr)auStack_200;
    }
    else {
      bVar5 = false;
      unaff_R12 = (_Base_ptr)auStack_200;
    }
  }
  if (bVar5) {
    p_Var24 = p_Var23[1]._M_left;
    iVar6 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var24);
    if ((int)this_00 == iVar6) {
      return iVar6;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar5 = StringToBool((string *)puVar21);
  pHVar12 = (HtmlparserCppTest *)p_Var24[1]._M_left;
  uVar13 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar12);
  bVar25 = (int)uVar13 != 0;
  if (bVar5 == bVar25) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  ValidateIsUrlStart();
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_248 = p_Var24;
  p_Stack_240 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar21,"=",",",&vStack_260);
  if (vStack_260.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_260.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar12->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_260.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar6 = std::__cxx11::string::compare((char *)str_00);
      if (iVar6 == 0) {
        ValidateState(pHVar12,str);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)str_00);
        if (iVar6 == 0) {
          ValidateTag(pHVar12,str);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)str_00);
          if (iVar6 == 0) {
            ValidateAttribute(pHVar12,str);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)str_00);
            if (iVar6 == 0) {
              ValidateValue(pHVar12,str);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)str_00);
              if (iVar6 == 0) {
                ValidateAttributeType(pHVar12,str);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)str_00);
                if (iVar6 == 0) {
                  ValidateAttributeQuoted(pHVar12,str);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar6 == 0) {
                    ValidateInJavascript(pHVar12,str);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar6 == 0) {
                      ValidateJavascriptQuoted(pHVar12,str);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar6 == 0) {
                        ValidateJavascriptState(pHVar12,str);
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar6 == 0) {
                          ValidateInCss(pHVar12,str);
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar6 == 0) {
                            ValidateLine(pHVar12,str);
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar6 == 0) {
                              ValidateColumn(pHVar12,str);
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar6 == 0) {
                                ValidateValueIndex(pHVar12,str);
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar6 == 0) {
                                  ValidateIsUrlStart(pHVar12,str);
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar6 == 0) {
                                    cVar15 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                    if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
                                      this_01 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_01);
                                      ppHVar16 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      *ppHVar16 = this_01;
                                    }
                                    ppHVar16 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar12->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar16,&pHVar12->parser_);
                                  }
                                  else {
                                    iVar6 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar6 == 0) {
                                      cVar15 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                      if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_260);
                                        _Unwind_Resume(extraout_RAX_06);
                                      }
                                      ppHVar16 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar12->parser_,*ppHVar16);
                                    }
                                    else {
                                      iVar6 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar6 == 0) {
                                        bVar5 = StringToBool(str);
                                        if (bVar5) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar12->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar6 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar6 == 0) {
                                          iVar6 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar12->parser_).parser_,iVar6);
                                        }
                                        else {
                                          iVar6 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar6 != 0) goto LAB_0010784b;
                                          bVar5 = StringToBool(str);
                                          if (bVar5) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar12->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_260.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_260);
  return extraout_EAX;
}

Assistant:

int HtmlparserCppTest::NameToId(const struct IdNameMap *list,
                                const string &name) {
  CHECK(list != NULL);
  while (list->name) {
    if (name.compare(list->name) == 0) {
      return list->id;
    }
    list++;
  }
  LOG(FATAL) << "Unknown name";
}